

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseNameAndCompare(xmlParserCtxtPtr ctxt,xmlChar *other)

{
  byte *pbVar1;
  byte bVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    pxVar6 = (xmlChar *)0x0;
  }
  else {
    pxVar3 = ctxt->input;
    pbVar4 = pxVar3->cur;
    bVar2 = *pbVar4;
    pbVar7 = pbVar4;
    pbVar8 = other;
    while ((bVar2 != 0 && (bVar2 == *pbVar8))) {
      pbVar8 = pbVar8 + 1;
      pbVar1 = pbVar7 + 1;
      pbVar7 = pbVar7 + 1;
      bVar2 = *pbVar1;
    }
    if (((*pbVar8 == 0) && (bVar2 < 0x3f)) &&
       ((0x4000000100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      pxVar3->col = pxVar3->col + ((int)pbVar7 - (int)pbVar4);
      pxVar3->cur = pbVar7;
      pxVar6 = &DAT_00000001;
    }
    else {
      pxVar5 = xmlParseName(ctxt);
      pxVar6 = &DAT_00000001;
      if (pxVar5 != other) {
        pxVar6 = pxVar5;
      }
    }
  }
  return pxVar6;
}

Assistant:

static const xmlChar *
xmlParseNameAndCompare(xmlParserCtxtPtr ctxt, xmlChar const *other) {
    register const xmlChar *cmp = other;
    register const xmlChar *in;
    const xmlChar *ret;

    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        return(NULL);

    in = ctxt->input->cur;
    while (*in != 0 && *in == *cmp) {
	++in;
	++cmp;
    }
    if (*cmp == 0 && (*in == '>' || IS_BLANK_CH (*in))) {
	/* success */
	ctxt->input->col += in - ctxt->input->cur;
	ctxt->input->cur = in;
	return (const xmlChar*) 1;
    }
    /* failure (or end of input buffer), check with full function */
    ret = xmlParseName (ctxt);
    /* strings coming from the dictionary direct compare possible */
    if (ret == other) {
	return (const xmlChar*) 1;
    }
    return ret;
}